

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  float *pfVar2;
  char *pcVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  longlong size;
  longlong words;
  longlong bi [100];
  long lStack_34188;
  void *pvStack_34180;
  long lStack_34178;
  char *pcStack_34170;
  float fStack_34164;
  undefined8 uStack_34160;
  float afStack_34158 [2];
  char *apcStack_34150 [59];
  long alStack_33f78 [99];
  char cStack_33c59;
  undefined4 uStack_33c58;
  char cStack_33c54;
  float afStack_33488 [2000];
  char acStack_31548 [2000];
  char acStack_30d78 [200008];
  
  if (argc < 2) {
    puts("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT");
LAB_0010121e:
    iVar5 = 0;
  }
  else {
    strcpy(acStack_31548,argv[1]);
    __stream = fopen(acStack_31548,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Input file not found");
    }
    else {
      lVar14 = 0;
      __isoc99_fscanf(__stream,"%lld",&lStack_34178);
      __isoc99_fscanf(__stream,"%lld",&lStack_34188);
      lVar11 = lStack_34178;
      pcStack_34170 = (char *)malloc(lStack_34178 * 0x32);
      do {
        pcVar7 = (char *)malloc(2000);
        lVar8 = lStack_34188;
        apcStack_34150[lVar14 + 0x13] = pcVar7;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x28);
      uVar16 = lStack_34188 * lVar11;
      pvStack_34180 = malloc(uVar16 * 4);
      if (pvStack_34180 != (void *)0x0) {
        if (0 < lVar11) {
          lVar11 = 0;
          lVar14 = 0;
          do {
            iVar5 = fgetc(__stream);
            pcVar7 = pcStack_34170;
            lVar8 = lVar14 * 0x32;
            pcStack_34170[lVar8] = (char)iVar5;
            iVar6 = feof(__stream);
            if ((char)iVar5 == ' ') {
              uVar16 = 0;
            }
            else {
              uVar16 = 0;
              if (iVar6 == 0) {
                uVar16 = 0;
                do {
                  uVar16 = ((char)iVar5 != '\n' && uVar16 < 0x32) + uVar16;
                  iVar5 = fgetc(__stream);
                  pcVar7[uVar16 + lVar8] = (char)iVar5;
                  iVar6 = feof(__stream);
                  if ((char)iVar5 == ' ') break;
                } while (iVar6 == 0);
              }
            }
            pvVar13 = pvStack_34180;
            pcVar7[uVar16 + lVar8] = '\0';
            fVar19 = 0.0;
            if (0 < lStack_34188) {
              lVar8 = 0;
              pvVar15 = pvStack_34180;
              do {
                fread((void *)(lStack_34188 * lVar11 + (long)pvVar15),4,1,__stream);
                lVar8 = lVar8 + 1;
                pvVar15 = (void *)((long)pvVar15 + 4);
              } while (lVar8 < lStack_34188);
              fVar19 = 0.0;
              if (0 < lStack_34188) {
                lVar8 = 0;
                do {
                  fVar4 = *(float *)((long)pvVar13 + lVar8 * 4 + lVar11 * lStack_34188);
                  fVar19 = fVar19 + fVar4 * fVar4;
                  lVar8 = lVar8 + 1;
                } while (lStack_34188 != lVar8);
              }
            }
            if (fVar19 < 0.0) {
              fVar19 = sqrtf(fVar19);
            }
            else {
              fVar19 = SQRT(fVar19);
            }
            if (0 < lStack_34188) {
              lVar8 = 0;
              do {
                *(float *)((long)pvVar13 + lVar8 * 4 + lStack_34188 * lVar11) =
                     *(float *)((long)pvVar13 + lVar8 * 4 + lStack_34188 * lVar11) / fVar19;
                lVar8 = lVar8 + 1;
              } while (lStack_34188 != lVar8);
            }
            lVar14 = lVar14 + 1;
            lVar11 = lVar11 + 4;
          } while (lVar14 < lStack_34178);
        }
        fclose(__stream);
        uStack_34160 = apcStack_34150[0x3a];
LAB_00101433:
        memset(afStack_34158,0,0xa0);
        lVar11 = 0;
        do {
          *apcStack_34150[lVar11 + 0x13] = '\0';
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x28);
        printf("Enter word or sentence (EXIT to break): ");
        uVar16 = 0;
        do {
          uVar9 = uVar16;
          iVar5 = fgetc(_stdin);
          *(char *)((long)&uStack_33c58 + uVar9) = (char)iVar5;
          if ((char)iVar5 == '\n') break;
          uVar16 = uVar9 + 1;
        } while (uVar9 < 1999);
        *(undefined1 *)((long)&uStack_33c58 + uVar9) = 0;
        if (cStack_33c54 != '\0' || uStack_33c58 != 0x54495845) {
          pcVar7 = acStack_30d78 + 1;
          lVar11 = 0;
          lVar14 = 0;
          do {
            lVar11 = lVar11 + 1;
            pcVar10 = pcVar7;
            do {
              pcVar10[-1] = (&cStack_33c59)[lVar11];
              *pcVar10 = '\0';
              pcVar3 = (char *)((long)&uStack_33c58 + lVar11);
              if (*pcVar3 == '\0') {
                lVar11 = 0;
                goto LAB_00101501;
              }
              pcVar10 = pcVar10 + 1;
              lVar11 = lVar11 + 1;
            } while (*pcVar3 != ' ');
            lVar14 = lVar14 + 1;
            pcVar7 = pcVar7 + 2000;
          } while( true );
        }
        goto LAB_0010121e;
      }
      printf("Cannot allocate memory: %lld MB    %lld  %lld\n",uVar16 >> 0x12 & 0xfffffffffff,lVar11
             ,lVar8);
    }
    iVar5 = -1;
  }
  return iVar5;
  while (bVar18 = lVar11 != lVar14, lVar11 = lVar11 + 1, bVar18) {
LAB_00101501:
    lVar8 = lStack_34178;
    if (lStack_34178 < 1) {
      lVar17 = 0;
    }
    else {
      lVar12 = 0;
      pcVar7 = pcStack_34170;
      do {
        iVar5 = strcmp(pcVar7,acStack_30d78 + lVar11 * 2000);
        lVar17 = lVar12;
        if (iVar5 == 0) break;
        lVar12 = lVar12 + 1;
        pcVar7 = pcVar7 + 0x32;
        lVar17 = lVar8;
      } while (lVar8 != lVar12);
    }
    lVar12 = lVar17;
    if (lVar17 == lVar8) {
      lVar12 = -1;
    }
    alStack_33f78[lVar11] = lVar12;
    printf("\nWord: %s  Position in vocabulary: %lld\n");
    pvVar13 = pvStack_34180;
    if (lVar17 == lVar8) {
      puts("Out of dictionary word!");
      goto LAB_00101433;
    }
  }
  if (lVar17 != -1) {
    puts(
        "\n                                              Word       Cosine distance\n------------------------------------------------------------------------"
        );
    lVar11 = lStack_34188;
    if (0 < lStack_34188) {
      memset(afStack_33488,0,lStack_34188 * 4);
    }
    lVar8 = 0;
    do {
      lVar17 = alStack_33f78[lVar8];
      if (lVar17 != -1 && 0 < lVar11) {
        lVar12 = 0;
        do {
          afStack_33488[lVar12] =
               *(float *)((long)pvVar13 + lVar12 * 4 + lVar17 * lVar11 * 4) + afStack_33488[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar11 != lVar12);
      }
      bVar18 = lVar8 != lVar14;
      lVar8 = lVar8 + 1;
    } while (bVar18);
    fVar19 = 0.0;
    if (0 < lVar11) {
      lVar8 = 0;
      do {
        fVar19 = fVar19 + afStack_33488[lVar8] * afStack_33488[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar11 != lVar8);
    }
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
    }
    else {
      fVar19 = SQRT(fVar19);
    }
    if (0 < lStack_34188) {
      lVar11 = 0;
      do {
        afStack_33488[lVar11] = afStack_33488[lVar11] / fVar19;
        lVar11 = lVar11 + 1;
      } while (lStack_34188 != lVar11);
    }
    lVar11 = 0;
    do {
      *(undefined8 *)((long)apcStack_34150 + lVar11 * 4 + -8) = 0xbf800000bf800000;
      *(undefined8 *)((long)apcStack_34150 + lVar11 * 4) = 0xbf800000bf800000;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x28);
    lVar11 = 0;
    do {
      *apcStack_34150[lVar11 + 0x13] = '\0';
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x28);
    if (0 < lStack_34178) {
      lVar17 = 0;
      lVar8 = 0;
      lVar11 = lStack_34178;
      do {
        lVar12 = -1;
        bVar18 = false;
        do {
          if (alStack_33f78[lVar12 + 1] == lVar8) {
            bVar18 = true;
          }
          lVar12 = lVar12 + 1;
        } while (lVar14 != lVar12);
        if (!bVar18) {
          if (lStack_34188 < 1) {
            fVar19 = 0.0;
          }
          else {
            fVar19 = 0.0;
            lVar12 = 0;
            do {
              fVar19 = fVar19 + afStack_33488[lVar12] *
                                *(float *)((long)pvVar13 + lVar12 * 4 + lStack_34188 * lVar17);
              lVar12 = lVar12 + 1;
            } while (lStack_34188 != lVar12);
          }
          uVar16 = 0;
LAB_00101737:
          pfVar2 = (float *)((long)apcStack_34150 + uVar16 * 4 + -8);
          if (fVar19 < *pfVar2 || fVar19 == *pfVar2) goto code_r0x0010173f;
          fStack_34164 = fVar19;
          if (uVar16 < 0x27) {
            uVar9 = 0x27;
            pcVar7 = uStack_34160;
            do {
              uVar1 = uVar9 - 1;
              *(undefined4 *)((long)apcStack_34150 + uVar9 * 4 + -8) =
                   *(undefined4 *)((long)&uStack_34160 + uVar9 * 4 + 4);
              pcVar10 = apcStack_34150[uVar9 + 0x12];
              strcpy(pcVar7,pcVar10);
              uVar9 = uVar1;
              pcVar7 = pcVar10;
            } while (uVar16 < uVar1);
          }
          *(float *)((long)apcStack_34150 + uVar16 * 4 + -8) = fStack_34164;
          strcpy(apcStack_34150[uVar16 + 0x13],pcStack_34170 + lVar8 * 0x32);
          lVar11 = lStack_34178;
          pvVar13 = pvStack_34180;
        }
LAB_001017bd:
        lVar8 = lVar8 + 1;
        lVar17 = lVar17 + 4;
      } while (lVar8 < lVar11);
    }
    lVar11 = 0;
    do {
      printf("%50s\t\t%f\n",(double)*(float *)((long)apcStack_34150 + lVar11 * 4 + -8));
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x28);
  }
  goto LAB_00101433;
code_r0x0010173f:
  uVar16 = uVar16 + 1;
  if (uVar16 == 0x28) goto LAB_001017bd;
  goto LAB_00101737;
}

Assistant:

int main(int argc, char **argv) {
  FILE *f;
  char st1[max_size];
  char *bestw[N];
  char file_name[max_size], st[100][max_size];
  float dist, len, bestd[N], vec[max_size];
  long long words, size, a, b, c, d, cn, bi[100];
  // char ch;
  float *M;
  char *vocab;
  if (argc < 2) {
    printf("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT\n");
    return 0;
  }
  strcpy(file_name, argv[1]);
  f = fopen(file_name, "rb");
  if (f == NULL) {
    printf("Input file not found\n");
    return -1;
  }
  fscanf(f, "%lld", &words);
  fscanf(f, "%lld", &size);
  vocab = (char *)malloc((long long)words * max_w * sizeof(char));
  for (a = 0; a < N; a++) bestw[a] = (char *)malloc(max_size * sizeof(char));
  M = (float *)malloc((long long)words * (long long)size * sizeof(float));
  if (M == NULL) {
    printf("Cannot allocate memory: %lld MB    %lld  %lld\n", (long long)words * size * sizeof(float) / 1048576, words, size);
    return -1;
  }
  for (b = 0; b < words; b++) {
    a = 0;
    while (1) {
      vocab[b * max_w + a] = fgetc(f);
      if (feof(f) || (vocab[b * max_w + a] == ' ')) break;
      if ((a < max_w) && (vocab[b * max_w + a] != '\n')) a++;
    }
    vocab[b * max_w + a] = 0;
    for (a = 0; a < size; a++) fread(&M[a + b * size], sizeof(float), 1, f);
    len = 0;
    for (a = 0; a < size; a++) len += M[a + b * size] * M[a + b * size];
    len = sqrt(len);
    for (a = 0; a < size; a++) M[a + b * size] /= len;
  }
  fclose(f);
  while (1) {
    for (a = 0; a < N; a++) bestd[a] = 0;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    printf("Enter word or sentence (EXIT to break): ");
    a = 0;
    while (1) {
      st1[a] = fgetc(stdin);
      if ((st1[a] == '\n') || (a >= max_size - 1)) {
        st1[a] = 0;
        break;
      }
      a++;
    }
    if (!strcmp(st1, "EXIT")) break;
    cn = 0;
    b = 0;
    c = 0;
    while (1) {
      st[cn][b] = st1[c];
      b++;
      c++;
      st[cn][b] = 0;
      if (st1[c] == 0) break;
      if (st1[c] == ' ') {
        cn++;
        b = 0;
        c++;
      }
    }
    cn++;
    for (a = 0; a < cn; a++) {
      for (b = 0; b < words; b++) if (!strcmp(&vocab[b * max_w], st[a])) break;
      if (b == words) b = -1;
      bi[a] = b;
      printf("\nWord: %s  Position in vocabulary: %lld\n", st[a], bi[a]);
      if (b == -1) {
        printf("Out of dictionary word!\n");
        break;
      }
    }
    if (b == -1) continue;
    printf("\n                                              Word       Cosine distance\n------------------------------------------------------------------------\n");
    for (a = 0; a < size; a++) vec[a] = 0;
    for (b = 0; b < cn; b++) {
      if (bi[b] == -1) continue;
      for (a = 0; a < size; a++) vec[a] += M[a + bi[b] * size];
    }
    len = 0;
    for (a = 0; a < size; a++) len += vec[a] * vec[a];
    len = sqrt(len);
    for (a = 0; a < size; a++) vec[a] /= len;
    for (a = 0; a < N; a++) bestd[a] = -1;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    for (c = 0; c < words; c++) {
      a = 0;
      for (b = 0; b < cn; b++) if (bi[b] == c) a = 1;
      if (a == 1) continue;
      dist = 0;
      for (a = 0; a < size; a++) dist += vec[a] * M[a + c * size];
      for (a = 0; a < N; a++) {
        if (dist > bestd[a]) {
          for (d = N - 1; d > a; d--) {
            bestd[d] = bestd[d - 1];
            strcpy(bestw[d], bestw[d - 1]);
          }
          bestd[a] = dist;
          strcpy(bestw[a], &vocab[c * max_w]);
          break;
        }
      }
    }
    for (a = 0; a < N; a++) printf("%50s\t\t%f\n", bestw[a], bestd[a]);
  }
  return 0;
}